

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O2

Abc_Cex_t * Abc_CexTransformUndc(Abc_Cex_t *p,char *pInit)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  Abc_Cex_t *pAVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  sVar3 = strlen(pInit);
  uVar5 = 0;
  uVar10 = 0;
  if (0 < (int)sVar3) {
    uVar10 = sVar3 & 0xffffffff;
  }
  iVar6 = 0;
  for (; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    iVar6 = iVar6 + (uint)(pInit[uVar5] == 'x');
  }
  pAVar4 = Abc_CexAlloc((int)sVar3,p->nPis - iVar6,p->iFrame + 1);
  pAVar4->iPo = p->iPo;
  iVar2 = p->iFrame;
  pAVar4->iFrame = iVar2;
  iVar7 = 0;
  for (uVar5 = 0; uVar10 != uVar5; uVar5 = uVar5 + 1) {
    cVar1 = pInit[uVar5];
    if ((cVar1 == '1') ||
       ((cVar1 == 'x' &&
        (uVar8 = (iVar7 - iVar6) + p->nRegs + p->nPis,
        ((uint)(&p[1].iPo)[(int)uVar8 >> 5] >> (uVar8 & 0x1f) & 1) != 0)))) {
      (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] =
           (&pAVar4[1].iPo)[uVar5 >> 5 & 0x7ffffff] | 1 << ((byte)uVar5 & 0x1f);
    }
    iVar7 = iVar7 + (uint)(cVar1 == 'x');
  }
  if (iVar7 != iVar6) {
    __assert_fail("iAddPi == nAddPis",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                  ,0x1d2,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
  }
  for (iVar6 = 0; iVar6 <= iVar2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; uVar8 = (int)uVar10 + iVar7, iVar7 < pAVar4->nPis; iVar7 = iVar7 + 1) {
      uVar9 = p->nPis * iVar6 + p->nRegs + iVar7;
      if (((uint)(&p[1].iPo)[(int)uVar9 >> 5] >> (uVar9 & 0x1f) & 1) != 0) {
        (&pAVar4[1].iPo)[uVar8 >> 5] = (&pAVar4[1].iPo)[uVar8 >> 5] | 1 << ((byte)uVar8 & 0x1f);
      }
    }
    uVar10 = (ulong)uVar8;
  }
  if ((int)uVar10 == pAVar4->nBits) {
    return pAVar4;
  }
  __assert_fail("iBit == pCex->nBits",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                ,0x1d8,"Abc_Cex_t *Abc_CexTransformUndc(Abc_Cex_t *, char *)");
}

Assistant:

Abc_Cex_t * Abc_CexTransformUndc( Abc_Cex_t * p, char * pInit )
{
    Abc_Cex_t * pCex;
    int nFlops = strlen(pInit);
    int i, f, iBit, iAddPi = 0, nAddPis = 0;
    // count how many flops got a new PI
    for ( i = 0; i < nFlops; i++ )
        nAddPis += (int)(pInit[i] == 'x');
    // create new CEX
    pCex = Abc_CexAlloc( nFlops, p->nPis - nAddPis, p->iFrame + 1 );
    pCex->iPo    = p->iPo;
    pCex->iFrame = p->iFrame;
    for ( iBit = 0; iBit < nFlops; iBit++ )
    {
        if ( pInit[iBit] == '1' || (pInit[iBit] == 'x' && Abc_InfoHasBit(p->pData, p->nRegs + p->nPis - nAddPis + iAddPi)) )
            Abc_InfoSetBit( pCex->pData, iBit );
        iAddPi += (int)(pInit[iBit] == 'x');
    }
    assert( iAddPi == nAddPis );
    // add timeframes
    for ( f = 0; f <= p->iFrame; f++ )
        for ( i = 0; i < pCex->nPis; i++, iBit++ )
            if ( Abc_InfoHasBit(p->pData, p->nRegs + p->nPis * f + i) )
                Abc_InfoSetBit( pCex->pData, iBit );
    assert( iBit == pCex->nBits );
    return pCex;
}